

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpOpenHttpGet(char *url,void **handle,char **contentType,int *contentLength,int *httpStatus,
                   int timeout)

{
  undefined4 local_38;
  int status;
  int timeout_local;
  int *httpStatus_local;
  int *contentLength_local;
  char **contentType_local;
  void **handle_local;
  char *url_local;
  
  local_38 = UpnpOpenHttpConnection(url,handle,timeout);
  if (local_38 == 0) {
    local_38 = UpnpMakeHttpRequest(UPNP_HTTPMETHOD_GET,url,*handle,(UpnpString *)0x0,(char *)0x0,0,
                                   timeout);
  }
  if (local_38 == 0) {
    local_38 = UpnpEndHttpRequest(*handle,timeout);
  }
  if (local_38 == 0) {
    local_38 = UpnpGetHttpResponse(*handle,(UpnpString *)0x0,contentType,contentLength,httpStatus,
                                   timeout);
  }
  return local_38;
}

Assistant:

int UpnpOpenHttpGet(const char *url,
	void **handle,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	int status = UpnpOpenHttpConnection(url, handle, timeout);
	if (status == UPNP_E_SUCCESS) {
		status = UpnpMakeHttpRequest(UPNP_HTTPMETHOD_GET,
			url,
			*handle,
			NULL,
			NULL,
			0,
			timeout);
	}
	if (status == UPNP_E_SUCCESS) {
		status = UpnpEndHttpRequest(*handle, timeout);
	}
	if (status == UPNP_E_SUCCESS) {
		status = UpnpGetHttpResponse(*handle,
			NULL,
			contentType,
			contentLength,
			httpStatus,
			timeout);
	}
	return status;
}